

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1905.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  long lVar1;
  long lVar2;
  long lVar3;
  int MAX;
  int unfinished;
  long local_1d8;
  long local_1d0;
  timeval local_1c8;
  long max_tout;
  fd_set E;
  fd_set W;
  fd_set R;
  
  lVar1 = curl_multi_init();
  if (lVar1 == 0) {
    return 1;
  }
  lVar2 = curl_share_init();
  if (lVar2 != 0) {
    curl_share_setopt(lVar2,1,2);
    curl_share_setopt(lVar2,1,2);
    lVar3 = curl_easy_init();
    if (lVar3 != 0) {
      local_1d0 = lVar2;
      curl_easy_setopt(lVar3,0x2774,lVar2);
      curl_easy_setopt(lVar3,0x2712,URL);
      curl_easy_setopt(lVar3,0x272f,"log/cookies1905");
      curl_easy_setopt(lVar3,0x2762,"log/cookies1905");
      local_1d8 = lVar3;
      curl_multi_add_handle(lVar1,lVar3);
      unfinished = 1;
      while (lVar3 = local_1d8, unfinished != 0) {
        MAX = 0;
        for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
          R.__fds_bits[lVar2] = 0;
        }
        for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
          W.__fds_bits[lVar2] = 0;
        }
        for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
          E.__fds_bits[lVar2] = 0;
        }
        curl_multi_perform(lVar1,&unfinished);
        curl_multi_fdset(lVar1,&R,&W,&E,&MAX);
        curl_multi_timeout(lVar1,&max_tout);
        if (max_tout < 1) {
          local_1c8.tv_sec = 0;
          local_1c8.tv_usec = 1000;
        }
        else {
          local_1c8.tv_sec = (ulong)max_tout / 1000;
          local_1c8.tv_usec = ((ulong)max_tout % 1000) * 1000;
        }
        select(MAX + 1,(fd_set *)&R,(fd_set *)&W,(fd_set *)&E,&local_1c8);
      }
      curl_easy_setopt(local_1d8,0x2797,"FLUSH");
      curl_easy_setopt(lVar3,0x2774,0);
      curl_multi_remove_handle(lVar1,lVar3);
      lVar2 = local_1d0;
      goto LAB_0010248d;
    }
  }
  lVar3 = 0;
LAB_0010248d:
  curl_easy_cleanup(lVar3);
  curl_share_cleanup(lVar2);
  curl_multi_cleanup(lVar1);
  curl_global_cleanup();
  return 0;
}

Assistant:

int test(char *URL)
{
  CURLM *cm = NULL;
  CURLSH *sh = NULL;
  CURL *ch = NULL;
  int unfinished;

  cm = curl_multi_init();
  if(!cm)
    return 1;
  sh = curl_share_init();
  if(!sh)
    goto cleanup;

  curl_share_setopt(sh, CURLSHOPT_SHARE, CURL_LOCK_DATA_COOKIE);
  curl_share_setopt(sh, CURLSHOPT_SHARE, CURL_LOCK_DATA_COOKIE);

  ch = curl_easy_init();
  if(!ch)
    goto cleanup;

  curl_easy_setopt(ch, CURLOPT_SHARE, sh);
  curl_easy_setopt(ch, CURLOPT_URL, URL);
  curl_easy_setopt(ch, CURLOPT_COOKIEFILE, "log/cookies1905");
  curl_easy_setopt(ch, CURLOPT_COOKIEJAR, "log/cookies1905");

  curl_multi_add_handle(cm, ch);

  unfinished = 1;
  while(unfinished) {
    int MAX = 0;
    long max_tout;
    fd_set R, W, E;
    struct timeval timeout;

    FD_ZERO(&R);
    FD_ZERO(&W);
    FD_ZERO(&E);
    curl_multi_perform(cm, &unfinished);

    curl_multi_fdset(cm, &R, &W, &E, &MAX);
    curl_multi_timeout(cm, &max_tout);

    if(max_tout > 0) {
      timeout.tv_sec = max_tout / 1000;
      timeout.tv_usec = (max_tout % 1000) * 1000;
    }
    else {
      timeout.tv_sec = 0;
      timeout.tv_usec = 1000;
    }

    select(MAX + 1, &R, &W, &E, &timeout);
  }

  curl_easy_setopt(ch, CURLOPT_COOKIELIST, "FLUSH");
  curl_easy_setopt(ch, CURLOPT_SHARE, NULL);

  curl_multi_remove_handle(cm, ch);
  cleanup:
  curl_easy_cleanup(ch);
  curl_share_cleanup(sh);
  curl_multi_cleanup(cm);
  curl_global_cleanup();

  return 0;
}